

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameToContents
               (vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *segs,
               BindingHash *bh)

{
  undefined8 this;
  bool bVar1;
  int iVar2;
  reference ppDVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte *pbVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppDVar7;
  Binding local_c0;
  byte local_91;
  iterator iStack_90;
  uchar c;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  DataSegment *local_58;
  DataSegment *seg;
  iterator __end1;
  iterator __begin1;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range1;
  string s;
  BindingHash *bh_local;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *segs_local;
  
  s.field_2._8_8_ = bh;
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin(segs);
  seg = (DataSegment *)
        std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end(segs);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                                *)&seg);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&__range1);
      return;
    }
    ppDVar3 = __gnu_cxx::
              __normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
              ::operator*(&__end1);
    local_58 = *ppDVar3;
    std::__cxx11::string::substr((ulong)&__range2,(ulong)&local_58->name);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__range2,"d_");
    std::__cxx11::string::~string((string *)&__range2);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&__range1,"d_");
      this_00 = &local_58->data;
      __end2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
      iStack_90 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff70), bVar1) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&__end2);
        local_91 = *pbVar4;
        iVar2 = isalnum((uint)local_91);
        if ((iVar2 != 0) || (local_91 == 0x5f)) {
          std::__cxx11::string::operator+=((string *)&__range1,local_91);
        }
        uVar5 = std::__cxx11::string::size();
        if (0x1d < uVar5) break;
        __gnu_cxx::
        __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator++(&__end2);
      }
      uVar5 = std::__cxx11::string::size();
      if ((6 < uVar5) &&
         (sVar6 = std::
                  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                  ::count((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                           *)s.field_2._8_8_,(key_type *)&__range1), sVar6 == 0)) {
        std::
        unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
        ::erase((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                 *)s.field_2._8_8_,&local_58->name);
        std::__cxx11::string::operator=((string *)&local_58->name,(string *)&__range1);
        this = s.field_2._8_8_;
        ppDVar7 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::operator[]
                            (segs,0);
        Binding::Binding(&local_c0,(Index)((long)&local_58 - (long)ppDVar7 >> 3));
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__range1,&local_c0);
      }
    }
    __gnu_cxx::
    __normal_iterator<wabt::DataSegment_**,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void RenameToContents(std::vector<DataSegment*>& segs, BindingHash& bh) {
  std::string s;
  for (auto seg : segs) {
    if (seg->name.substr(0, 2) != "d_") {
      // This segment was named explicitly by a symbol.
      // FIXME: this is not a great check, a symbol could start with d_.
      continue;
    }
    s = "d_";
    for (auto c : seg->data) {
      if (isalnum(c) || c == '_') {
        s += static_cast<char>(c);
      }
      if (s.size() >= max_content_identifier_size) {
        // We truncate any very long names, since those make for hard to
        // format output. They can be somewhat long though, since data segment
        // references tend to not occur that often.
        break;
      }
    }
    if (s.size() < min_content_identifier_size) {
      // It is useful to have a minimum, since if there few printable characters
      // in a data section, that is probably a sign of binary, and those few
      // characters are not going to be very significant.
      continue;
    }
    // We could do the same disambiguition as RenameToIdentifier and
    // GenerateNames do, but if we come up with a clashing name here it is
    // likely a sign of not very meaningful binary data, so it is easier to
    // just keep the original generated name in that case.
    if (bh.count(s) != 0) {
      continue;
    }
    // Remove original entry.
    bh.erase(seg->name);
    seg->name = s;
    bh.emplace(s, Binding(static_cast<Index>(&seg - &segs[0])));
  }
}